

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* split<char>(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *__return_storage_ptr__,
             basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,string *delim,
             uint limit)

{
  size_type sVar1;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  uint local_40;
  undefined4 local_3c;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar1 = delim->_M_string_length;
  local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  if (sVar1 != 0) {
    if (sVar1 == 1) {
      pcVar2 = (delim->_M_dataplus)._M_p;
      local_3c = (undefined4)CONCAT71((int7)((ulong)pcVar2 >> 8),*pcVar2 == '\n');
    }
    else {
      local_3c = 0;
    }
    uVar6 = 0;
    local_40 = limit;
    do {
      lVar4 = std::__cxx11::string::find((char *)s,(ulong)(delim->_M_dataplus)._M_p,(ulong)uVar6);
      if (local_40 == 0) {
        if (lVar4 != -1) goto LAB_0011650a;
LAB_0011657a:
        std::__cxx11::string::substr((ulong)&local_60,(ulong)s);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_38,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        bVar3 = false;
      }
      else {
        if ((lVar4 == -1) ||
           ((long)*(pointer *)(local_38 + 8) - *(long *)local_38 >> 5 == (ulong)limit))
        goto LAB_0011657a;
LAB_0011650a:
        std::__cxx11::string::substr((ulong)&local_60,(ulong)s);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_38,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        bVar3 = true;
        uVar6 = (uint)(lVar4 + sVar1);
        if (((char)local_3c != '\0') &&
           (uVar5 = lVar4 + sVar1 & 0xffffffff, uVar5 < s->_M_string_length)) {
          uVar6 = ((s->_M_dataplus)._M_p[uVar5] == '\r') + uVar6;
        }
      }
    } while (bVar3);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_38;
}

Assistant:

std::vector<std::basic_string<C>> split(const std::basic_string<C>& s,
                                        const std::string& delim = " ",
                                        unsigned limit = 0)
{
    std::vector<std::basic_string<C>> args;
    auto l = delim.length();
    if (l == 0)
        return args;
    unsigned pos = 0;
    bool crlf = (delim.size() == 1 && delim[0] == 10);
    while (true) {
        auto newpos = s.find(delim, pos);
        if ((limit && args.size() == limit) || newpos == std::string::npos) {
            args.push_back(s.substr(pos));
            break;
        }
        args.push_back(s.substr(pos, newpos - pos));
        pos = newpos + l;
        if (crlf && pos < s.length() && s[pos] == 13)
            pos++;
    }

    return args;
}